

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQChar * __thiscall SQLexer::Tok2Str(SQLexer *this,SQInteger tok)

{
  SQInteger x;
  SQTable *in_RSI;
  SQObjectPtr *in_RDI;
  SQInteger nitr;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr itr;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQObjectValue in_stack_ffffffffffffffb0;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc7;
  SQTable *in_stack_ffffffffffffffc8;
  SQObjectValue local_30;
  SQObjectPtr local_28;
  SQTable *local_18;
  _HashNode **local_8;
  
  local_18 = in_RSI;
  ::SQObjectPtr::SQObjectPtr(&local_28);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc8);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa8);
  do {
    x = SQTable::Next(in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7,
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0.nInteger,
                      in_stack_ffffffffffffffa8);
    if (x == -1) {
      local_8 = (_HashNode **)0x0;
      goto LAB_00134d35;
    }
    ::SQObjectPtr::operator=(in_RDI,x);
  } while (in_stack_ffffffffffffffb0.pTable != local_18);
  local_8 = &(local_30.pTable)->_firstfree;
LAB_00134d35:
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  return (SQChar *)local_8;
}

Assistant:

const SQChar *SQLexer::Tok2Str(SQInteger tok)
{
    SQObjectPtr itr, key, val;
    SQInteger nitr;
    while((nitr = _keywords->Next(false,itr, key, val)) != -1) {
        itr = (SQInteger)nitr;
        if(((SQInteger)_integer(val)) == tok)
            return _stringval(key);
    }
    return NULL;
}